

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O3

void __thiscall Code_generator::visit(Code_generator *this,Inst_logic *s)

{
  uint uVar1;
  Register *pRVar2;
  short sVar3;
  string local_40;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  pRVar2 = s->rn;
  if (7 < pRVar2->n) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Invalid register","");
    error_report(&pRVar2->location,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  uVar1 = s->operation;
  if (uVar1 == 0x13e) {
    sVar3 = -0x4000;
  }
  else if (uVar1 == 0x13f) {
    sVar3 = -0x3800;
  }
  else {
    sVar3 = -0x3000;
    if (uVar1 != 0x140) {
      sVar3 = 0;
    }
  }
  ast::Sections::write16
            ((s->super_Instruction).super_Statement.section_index,
             (s->super_Instruction).super_Statement.section_offset,
             (short)(s->rn->n << 4) + (short)(s->rm->n << 7) + sVar3 + (short)s->rd->n);
  return;
}

Assistant:

void Code_generator::visit(Inst_logic *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");

	Sections::write16(s->section_index, s->section_offset,
		      static_cast<uint16_t> ((
				s->operation == AND ? AND_OPCODE
		      			: s->operation == OR ? OR_OPCODE
						: s->operation == EOR ? XOR_OPCODE : 0)
				+ (s->rm->n << RM_POSITION)
				+ (s->rn->n << RN_POSITION)
				+ (s->rd->n << RD_POSITION)));
}